

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O0

REF_STATUS ref_validation_node_cell(REF_CELL ref_cell,REF_INT node)

{
  uint uVar1;
  uint local_a8;
  uint local_a4;
  int local_a0;
  uint local_98;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nodes [27];
  uint local_24;
  REF_INT cell_node;
  REF_INT cell;
  REF_INT item;
  REF_INT node_local;
  REF_CELL ref_cell_local;
  
  printf("node %d\n",(ulong)(uint)node);
  if ((node < 0) || (ref_cell->ref_adj->nnode <= node)) {
    local_a0 = -1;
  }
  else {
    local_a0 = ref_cell->ref_adj->first[node];
  }
  cell_node = local_a0;
  if (local_a0 == -1) {
    local_a4 = 0xffffffff;
  }
  else {
    local_a4 = ref_cell->ref_adj->item[local_a0].ref;
  }
  local_24 = local_a4;
  while( true ) {
    if (cell_node == -1) {
      return 0;
    }
    printf("cell %d:",(ulong)local_24);
    uVar1 = ref_cell_nodes(ref_cell,local_24,(REF_INT *)&local_98);
    if (uVar1 != 0) break;
    for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell->node_per; nodes[0x1a] = nodes[0x1a] + 1) {
      printf(" %d",(ulong)(&local_98)[nodes[0x1a]]);
    }
    printf("\n");
    cell_node = ref_cell->ref_adj->item[cell_node].next;
    if (cell_node == -1) {
      local_a8 = 0xffffffff;
    }
    else {
      local_a8 = ref_cell->ref_adj->item[cell_node].ref;
    }
    local_24 = local_a8;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",0xde
         ,"ref_validation_node_cell",(ulong)uVar1,"get cell");
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_validation_node_cell(REF_CELL ref_cell,
                                                   REF_INT node) {
  REF_INT item, cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  printf("node %d\n", node);
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    printf("cell %d:", cell);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get cell");
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      printf(" %d", nodes[cell_node]);
    }
    printf("\n");
  }
  return REF_SUCCESS;
}